

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O3

void __thiscall
llbuild::basic::StringList::StringList<llvm::StringRef>
          (StringList *this,ArrayRef<llvm::StringRef> values)

{
  StringRef *pSVar1;
  size_t __n;
  char *__dest;
  void *pvVar2;
  long lVar3;
  size_type sVar4;
  StringRef *pSVar5;
  long lVar6;
  uint64_t uVar7;
  char *pcVar8;
  
  sVar4 = values.Length;
  pSVar5 = values.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  if (sVar4 == 0) {
    __dest = (char *)operator_new__(1);
    this->contents = __dest;
  }
  else {
    pSVar1 = pSVar5 + sVar4;
    lVar3 = 0;
    uVar7 = 0;
    do {
      lVar6 = uVar7 + *(long *)((long)&pSVar5->Length + lVar3);
      uVar7 = lVar6 + 1;
      this->size = uVar7;
      lVar3 = lVar3 + 0x10;
    } while (sVar4 * 0x10 != lVar3);
    __dest = (char *)operator_new__(lVar6 + 2);
    this->contents = __dest;
    if (sVar4 != 0) {
      do {
        pcVar8 = pSVar5->Data;
        __n = pSVar5->Length;
        if ((__n != 0) &&
           (pvVar2 = memchr(pcVar8,0,__n),
           (long)pvVar2 - (long)pcVar8 != -1 && pvVar2 != (void *)0x0)) {
          __assert_fail("value.find(\'\\0\') == StringRef::npos",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                        ,0x40,
                        "llbuild::basic::StringList::StringList(const ArrayRef<StringType>) [StringType = llvm::StringRef]"
                       );
        }
        memcpy(__dest,pcVar8,__n);
        pcVar8 = __dest + __n;
        __dest = pcVar8 + 1;
        *pcVar8 = '\0';
        pSVar5 = pSVar5 + 1;
      } while (pSVar5 != pSVar1);
    }
  }
  *__dest = '\0';
  return;
}

Assistant:

explicit StringList(const ArrayRef<StringType> values) {
    // Construct the concatenated data.
    for (auto value: values) {
      size += value.size() + 1;
    }
    // Make sure to allocate at least 1 byte.
    char* p = nullptr;
    contents = p = new char[size + 1];
    for (auto value: values) {
      assert(value.find('\0') == StringRef::npos);
      memcpy(p, value.data(), value.size());
      p += value.size();
      *p++ = '\0';
    }
    *p = '\0';
  }